

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O3

void __thiscall entityx::BaseReceiver::~BaseReceiver(BaseReceiver *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *this_01;
  _Hash_node_base *connection;
  _Atomic_word *p_Var3;
  _Atomic_word _Var4;
  bool bVar5;
  
  this->_vptr_BaseReceiver = (_func_int **)&PTR__BaseReceiver_001cfaf8;
  for (p_Var2 = (this->connections_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[3]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_01 = p_Var2[2]._M_nxt;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
      }
      connection = p_Var2[4]._M_nxt;
      if (this_00->_M_use_count != 0) {
        _Var4 = this_00->_M_use_count;
        do {
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar5 = _Var4 == iVar1;
          if (bVar5) {
            this_00->_M_use_count = _Var4 + 1;
            iVar1 = _Var4;
          }
          _Var4 = iVar1;
          UNLOCK();
        } while (!bVar5);
        Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
        disconnect((ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)this_01
                   ,(size_t)connection);
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3 = &this_00->_M_weak_count;
        _Var4 = *p_Var3;
        *p_Var3 = *p_Var3 + -1;
        UNLOCK();
      }
      else {
        _Var4 = this_00->_M_weak_count;
        this_00->_M_weak_count = _Var4 + -1;
      }
      if (_Var4 == 1) {
        (*this_00->_vptr__Sp_counted_base[3])(this_00);
      }
    }
  }
  Catch::clara::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->connections_)._M_h);
  return;
}

Assistant:

virtual ~BaseReceiver() {
    for (auto connection : connections_) {
      auto &ptr = connection.second.first;
      if (!ptr.expired()) {
        ptr.lock()->disconnect(connection.second.second);
      }
    }
  }